

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  ostream *os;
  SourceLineInfo local_48;
  Colour local_19 [8];
  Colour colourGuard;
  
  local_19[0].m_moved = false;
  Colour::use(FileName);
  os = this->stream;
  SourceLineInfo::SourceLineInfo(&local_48,&(this->result->m_info).lineInfo);
  operator<<(os,&local_48);
  std::operator<<(os,": ");
  std::__cxx11::string::~string((string *)&local_48);
  Colour::~Colour(local_19);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ": ";
            }